

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_color.c
# Opt level: O0

int gdColorMatch(gdImagePtr im,int col1,int col2,float threshold)

{
  int local_60;
  int local_58;
  uint local_54;
  uint local_4c;
  int local_48;
  int local_40;
  int local_3c;
  int local_34;
  int dist;
  int da;
  int db;
  int dg;
  int dr;
  float threshold_local;
  int col2_local;
  int col1_local;
  gdImagePtr im_local;
  
  if (im->trueColor == 0) {
    local_34 = im->red[col1];
  }
  else {
    local_34 = (int)(col1 & 0xff0000U) >> 0x10;
  }
  if (im->trueColor == 0) {
    local_3c = im->red[col2];
  }
  else {
    local_3c = (int)(col2 & 0xff0000U) >> 0x10;
  }
  if (im->trueColor == 0) {
    local_40 = im->green[col1];
  }
  else {
    local_40 = (int)(col1 & 0xff00U) >> 8;
  }
  if (im->trueColor == 0) {
    local_48 = im->green[col2];
  }
  else {
    local_48 = (int)(col2 & 0xff00U) >> 8;
  }
  if (im->trueColor == 0) {
    local_4c = im->blue[col1];
  }
  else {
    local_4c = col1 & 0xff;
  }
  if (im->trueColor == 0) {
    local_54 = im->blue[col2];
  }
  else {
    local_54 = col2 & 0xff;
  }
  if (im->trueColor == 0) {
    local_58 = im->alpha[col1];
  }
  else {
    local_58 = (int)(col1 & 0x7f000000U) >> 0x18;
  }
  if (im->trueColor == 0) {
    local_60 = im->alpha[col2];
  }
  else {
    local_60 = (int)(col2 & 0x7f000000U) >> 0x18;
  }
  return (int)(((float)(int)((local_34 - local_3c) * (local_34 - local_3c) +
                             (local_40 - local_48) * (local_40 - local_48) +
                             (local_4c - local_54) * (local_4c - local_54) +
                            (local_58 - local_60) * (local_58 - local_60)) * 100.0) / 195075.0 <
              threshold);
}

Assistant:

int gdColorMatch(gdImagePtr im, int col1, int col2, float threshold)
{
	const int dr = gdImageRed(im, col1) - gdImageRed(im, col2);
	const int dg = gdImageGreen(im, col1) - gdImageGreen(im, col2);
	const int db = gdImageBlue(im, col1) - gdImageBlue(im, col2);
	const int da = gdImageAlpha(im, col1) - gdImageAlpha(im, col2);
	const int dist = dr * dr + dg * dg + db * db + da * da;

	return (100.0 * dist / 195075) < threshold;
}